

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
* llvm::DWARFYAML::EmitDebugSections
            (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
             *__return_storage_ptr__,Data *DI,bool ApplyFixups)

{
  StringRef local_d8;
  StringRef local_c8;
  StringRef local_b8;
  StringRef local_a8;
  StringRef local_98;
  StringRef local_88;
  StringRef local_78;
  undefined1 local_68 [8];
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  DebugSections;
  undefined1 local_38 [8];
  DIEFixupVisitor DIFixer;
  bool ApplyFixups_local;
  Data *DI_local;
  
  DIFixer.Length._7_1_ = ApplyFixups;
  if (ApplyFixups) {
    anon_unknown.dwarf_353748f::DIEFixupVisitor::DIEFixupVisitor((DIEFixupVisitor *)local_38,DI);
    VisitorImpl<llvm::DWARFYAML::Data>::traverseDebugInfo
              ((VisitorImpl<llvm::DWARFYAML::Data> *)local_38);
    anon_unknown.dwarf_353748f::DIEFixupVisitor::~DIEFixupVisitor((DIEFixupVisitor *)local_38);
  }
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  ::StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
               *)local_68);
  StringRef::StringRef(&local_78,"debug_info");
  EmitDebugSectionImpl
            (DI,EmitDebugInfo,local_78,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)local_68);
  StringRef::StringRef(&local_88,"debug_line");
  EmitDebugSectionImpl
            (DI,EmitDebugLine,local_88,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)local_68);
  StringRef::StringRef(&local_98,"debug_str");
  EmitDebugSectionImpl
            (DI,EmitDebugStr,local_98,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)local_68);
  StringRef::StringRef(&local_a8,"debug_abbrev");
  EmitDebugSectionImpl
            (DI,EmitDebugAbbrev,local_a8,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)local_68);
  StringRef::StringRef(&local_b8,"debug_aranges");
  EmitDebugSectionImpl
            (DI,EmitDebugAranges,local_b8,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)local_68);
  StringRef::StringRef(&local_c8,"debug_ranges");
  EmitDebugSectionImpl
            (DI,EmitDebugRanges,local_c8,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)local_68);
  StringRef::StringRef(&local_d8,"debug_loc");
  EmitDebugSectionImpl
            (DI,EmitDebugLoc,local_d8,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)local_68);
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  ::StringMap(__return_storage_ptr__,
              (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
               *)local_68);
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  ::~StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                *)local_68);
  return __return_storage_ptr__;
}

Assistant:

StringMap<std::unique_ptr<MemoryBuffer>>
EmitDebugSections(llvm::DWARFYAML::Data &DI, bool ApplyFixups) {
  if (ApplyFixups) {
    DIEFixupVisitor DIFixer(DI);
    DIFixer.traverseDebugInfo();
  }

  StringMap<std::unique_ptr<MemoryBuffer>> DebugSections;
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugInfo, "debug_info",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugLine, "debug_line",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugStr, "debug_str",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugAbbrev, "debug_abbrev",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugAranges, "debug_aranges",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugRanges, "debug_ranges",
                       DebugSections); // XXX BINARYEN
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugLoc, "debug_loc",
                       DebugSections); // XXX BINARYEN
  return std::move(DebugSections);
}